

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

void __thiscall
llvm::Triple::getEnvironmentVersion(Triple *this,uint *Major,uint *Minor,uint *Micro)

{
  int iVar1;
  ulong __n;
  StringRef Name;
  StringRef SVar2;
  char *__s1;
  
  Name = getEnvironmentName(this);
  __s1 = Name.Data;
  SVar2 = getEnvironmentTypeName(this->Environment);
  __n = SVar2.Length;
  if (__n <= Name.Length) {
    if (__n != 0) {
      iVar1 = bcmp(__s1,SVar2.Data,__n);
      if (iVar1 != 0) goto LAB_001a4bcb;
    }
    Name.Length = Name.Length - __n;
    Name.Data = __s1 + __n;
  }
LAB_001a4bcb:
  parseVersionFromName(Name,Major,Minor,Micro);
  return;
}

Assistant:

void Triple::getEnvironmentVersion(unsigned &Major, unsigned &Minor,
                                   unsigned &Micro) const {
  StringRef EnvironmentName = getEnvironmentName();
  StringRef EnvironmentTypeName = getEnvironmentTypeName(getEnvironment());
  if (EnvironmentName.startswith(EnvironmentTypeName))
    EnvironmentName = EnvironmentName.substr(EnvironmentTypeName.size());

  parseVersionFromName(EnvironmentName, Major, Minor, Micro);
}